

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

bool findKeyPresses<stSampleMulti<short,4>>
               (TWaveformViewT<TSampleMI16> *waveform,TKeyPressCollectionT<TSampleMI16> *res,
               TWaveformT<TSampleMI16> *waveformThreshold,TWaveformT<TSampleMI16> *waveformMax,
               double thresholdBackground,int historySize,int historySizeReset,bool removeLowPower)

{
  short sVar1;
  stSampleMulti<short,_4> *psVar2;
  size_type __n;
  pointer psVar3;
  value_type *__x;
  long lVar4;
  long lVar5;
  pointer psVar6;
  bool bVar7;
  _Elt_pointer plVar8;
  long lVar9;
  size_type sVar10;
  long lVar11;
  pointer psVar12;
  size_type sVar13;
  TKeyPressCollectionT<TSampleMI16> *__range3;
  int iVar14;
  iterator __end3;
  short sVar15;
  iterator __begin3_1;
  long lVar16;
  int i;
  size_type __n_00;
  pointer psVar17;
  int iVar18;
  double dVar19;
  undefined1 auVar21 [16];
  double dVar22;
  double dVar23;
  long local_140;
  double local_138;
  vector<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_> *local_130;
  int local_124;
  TWaveformT<TSampleMI16> waveformAbs;
  type tmp;
  deque<long,_std::allocator<long>_> que;
  vector<double,_std::allocator<double>_> rbSamples;
  undefined1 auVar20 [16];
  
  psVar17 = (res->
            super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
            ).
            super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((res->
      super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
      ).
      super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar17) {
    (res->
    super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
    ).
    super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = psVar17;
  }
  local_130 = waveformMax;
  local_124 = historySizeReset;
  std::vector<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>::resize
            (waveformThreshold,waveform->n);
  std::vector<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>::resize
            (local_130,waveform->n);
  que.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&rbSamples,(long)(historySize * 8),(value_type_conflict5 *)&que,(allocator_type *)&tmp)
  ;
  __n_00 = (size_type)historySize;
  std::deque<long,_std::allocator<long>_>::deque(&que,__n_00,(allocator_type *)&tmp);
  psVar2 = waveform->samples;
  __n = waveform->n;
  std::vector<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>::vector
            (&waveformAbs,__n,(allocator_type *)&tmp);
  sVar10 = 0;
  sVar13 = 0;
  if (0 < (long)__n) {
    sVar13 = __n;
  }
  for (; sVar13 != sVar10; sVar10 = sVar10 + 1) {
    sVar1 = psVar2[sVar10].super_array<short,_4UL>._M_elems[0];
    sVar15 = -sVar1;
    if (0 < sVar1) {
      sVar15 = sVar1;
    }
    waveformAbs.
    super__Vector_base<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>._M_impl.
    super__Vector_impl_data._M_start[sVar10].super_array<short,_4UL>._M_elems[0] = sVar15;
  }
  local_138 = 0.0;
  iVar14 = 0;
  for (local_140 = 0; local_140 < (long)__n; local_140 = local_140 + 1) {
    if (historySize / 2 <= local_140) {
      lVar11 = (long)rbSamples.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)rbSamples.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
      auVar20._8_4_ =
           (int)((long)rbSamples.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)rbSamples.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start >> 0x23);
      auVar20._0_8_ = lVar11;
      auVar20._12_4_ = 0x45300000;
      iVar18 = (int)lVar11;
      dVar22 = (auVar20._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,iVar18) - 4503599627370496.0);
      dVar23 = rbSamples.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar14];
      dVar19 = (double)(int)waveformAbs.
                            super__Vector_base<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[local_140].
                            super_array<short,_4UL>._M_elems[0];
      rbSamples.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar14] = dVar19;
      local_138 = ((local_138 * dVar22 - dVar23) + dVar19) / dVar22;
      iVar14 = iVar14 + 1;
      if (iVar18 <= iVar14) {
        iVar14 = 0;
      }
    }
    if (local_140 < (long)__n_00) {
      while (que.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
             _M_finish._M_cur !=
             que.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
             _M_start._M_cur) {
        plVar8 = que.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
                 _M_finish._M_cur;
        if (que.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
            _M_finish._M_cur ==
            que.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
            _M_finish._M_first) {
          plVar8 = que.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data
                   ._M_finish._M_node[-1] + 0x40;
        }
        bVar7 = std::operator>=(&waveformAbs.
                                 super__Vector_base<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[local_140].
                                 super_array<short,_4UL>,
                                &waveformAbs.
                                 super__Vector_base<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[plVar8[-1]].
                                 super_array<short,_4UL>);
        if (!bVar7) break;
        std::deque<long,_std::allocator<long>_>::pop_back(&que);
      }
      std::deque<long,_std::allocator<long>_>::push_back(&que,&local_140);
    }
    else {
      while( true ) {
        if ((que.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
             _M_finish._M_cur ==
             que.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
             _M_start._M_cur) ||
           ((long)(local_140 - __n_00) <
            *que.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
             _M_start._M_cur)) break;
        std::deque<long,_std::allocator<long>_>::pop_front(&que);
      }
      while (que.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
             _M_finish._M_cur !=
             que.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
             _M_start._M_cur) {
        plVar8 = que.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
                 _M_finish._M_cur;
        if (que.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
            _M_finish._M_cur ==
            que.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
            _M_finish._M_first) {
          plVar8 = que.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data
                   ._M_finish._M_node[-1] + 0x40;
        }
        bVar7 = std::operator>=(&waveformAbs.
                                 super__Vector_base<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[local_140].
                                 super_array<short,_4UL>,
                                &waveformAbs.
                                 super__Vector_base<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[plVar8[-1]].
                                 super_array<short,_4UL>);
        if (!bVar7) break;
        std::deque<long,_std::allocator<long>_>::pop_back(&que);
      }
      std::deque<long,_std::allocator<long>_>::push_back(&que,&local_140);
      psVar17 = (pointer)(local_140 - historySize / 2);
      if ((((long)psVar17 < (long)(__n - (long)(historySize * 2)) &&
            (long)(historySize * 2) <= (long)psVar17) &&
          ((pointer)*que.super__Deque_base<long,_std::allocator<long>_>._M_impl.
                     super__Deque_impl_data._M_start._M_cur == psVar17)) &&
         (local_138 * thresholdBackground <
          (double)(int)waveformAbs.
                       super__Vector_base<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)psVar17].
                       super_array<short,_4UL>._M_elems[0])) {
        tmp.
        super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
        .
        super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)waveform->samples;
        tmp.
        super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
        .
        super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_4_ = (undefined4)waveform->n;
        tmp.
        super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
        .
        super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._4_4_ = (undefined4)((ulong)waveform->n >> 0x20);
        tmp.nClusters = 0;
        tmp._28_4_ = 0;
        tmp.
        super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
        .
        super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = psVar17;
        std::
        vector<stKeyPressData<stSampleMulti<short,4>>,std::allocator<stKeyPressData<stSampleMulti<short,4>>>>
        ::emplace_back<stKeyPressData<stSampleMulti<short,4>>>
                  ((vector<stKeyPressData<stSampleMulti<short,4>>,std::allocator<stKeyPressData<stSampleMulti<short,4>>>>
                    *)res,(stKeyPressData<stSampleMulti<short,_4>_> *)&tmp);
      }
      (waveformThreshold->
      super__Vector_base<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>).
      _M_impl.super__Vector_impl_data._M_start[(long)psVar17].super_array<short,_4UL>._M_elems[0] =
           (short)(int)(local_138 * thresholdBackground);
      *(undefined8 *)
       (local_130->
       super__Vector_base<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>).
       _M_impl.super__Vector_impl_data._M_start[(long)psVar17].super_array<short,_4UL>._M_elems =
           *(undefined8 *)
            waveformAbs.
            super__Vector_base<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start
            [*que.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
              _M_start._M_cur].super_array<short,_4UL>._M_elems;
    }
  }
  if (removeLowPower) {
    do {
      psVar17 = (res->
                super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                ).
                super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar3 = (res->
               super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
               ).
               super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar11 = (long)psVar3 - (long)psVar17;
      dVar23 = 0.0;
      for (psVar12 = psVar17; psVar12 != psVar3; psVar12 = psVar12 + 1) {
        dVar23 = dVar23 + (double)(int)waveformAbs.
                                       super__Vector_base<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[psVar12->pos].
                                       super_array<short,_4UL>._M_elems[0];
      }
      lVar9 = lVar11 / 0x30;
      auVar21._8_4_ = (int)((ulong)lVar9 >> 0x20);
      auVar21._0_8_ = lVar9;
      auVar21._12_4_ = 0x45300000;
      tmp.
      super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
      .
      super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_4_ = SUB84(psVar3,0);
      tmp.
      super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
      .
      super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._4_4_ = (undefined4)((ulong)psVar3 >> 0x20);
      psVar12 = (res->
                super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                ).
                super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      tmp.
      super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
      .
      super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = SUB84(psVar12,0);
      tmp.
      super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
      .
      super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           (undefined4)((ulong)psVar12 >> 0x20);
      (res->
      super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
      ).
      super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (res->
      super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
      ).
      super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (res->
      super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
      ).
      super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      tmp.nClusters = res->nClusters;
      local_138 = (dVar23 / ((auVar21._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0))) * 0.3;
      tmp.
      super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
      .
      super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = psVar17;
      for (; psVar17 != psVar3; psVar17 = psVar17 + 1) {
        if (local_138 <
            (double)(int)waveformAbs.
                         super__Vector_base<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[psVar17->pos].
                         super_array<short,_4UL>._M_elems[0]) {
          std::
          vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
          ::push_back(&res->
                       super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                      ,psVar17);
        }
      }
      psVar17 = (res->
                super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                ).
                super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      psVar3 = (res->
               super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
               ).
               super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::
      _Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
      ::~_Vector_base((_Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                       *)&tmp);
    } while ((long)psVar17 - (long)psVar3 != lVar11);
  }
  __x = (res->
        super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
        ).
        super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  lVar11 = 0x30;
  if (1 < (ulong)(((long)(res->
                         super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                         ).
                         super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)__x) / 0x30)) {
    tmp.
    super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
    .
    super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    tmp.
    super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
    .
    super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    tmp.nClusters = 0;
    tmp.
    super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
    .
    super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    tmp.
    super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
    .
    super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
    tmp.
    super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
    .
    super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
    std::
    vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
    ::push_back(&tmp.
                 super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                ,__x);
    lVar16 = (long)local_124;
    for (lVar9 = 1;
        psVar17 = (res->
                  super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                  ).
                  super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        lVar9 < (int)(((long)(res->
                             super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                             ).
                             super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)psVar17) / 0x30);
        lVar9 = lVar9 + 1) {
      lVar4 = *(long *)((long)&psVar17->pos + lVar11);
      lVar5 = *(long *)(CONCAT44(tmp.
                                 super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                                 .
                                 super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                 tmp.
                                 super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                                 .
                                 super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._0_4_) + -0x20);
      if (lVar16 < lVar4 - lVar5) {
LAB_00117b08:
        std::
        vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
        ::push_back(&tmp.
                     super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                    ,(value_type *)((long)&(psVar17->waveform).samples + lVar11));
      }
      else {
        psVar6 = (local_130->
                 super__Vector_base<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        bVar7 = std::operator<(&psVar6[lVar5].super_array<short,_4UL>,
                               &psVar6[lVar4].super_array<short,_4UL>);
        if (bVar7) {
          psVar17 = (res->
                    super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                    ).
                    super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          goto LAB_00117b08;
        }
      }
      lVar11 = lVar11 + 0x30;
    }
    std::swap<stKeyPressCollection<stSampleMulti<short,4>>>(res,&tmp);
    std::
    _Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
    ::~_Vector_base((_Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                     *)&tmp);
  }
  std::_Vector_base<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>::
  ~_Vector_base(&waveformAbs.
                 super__Vector_base<stSampleMulti<short,_4>,_std::allocator<stSampleMulti<short,_4>_>_>
               );
  std::_Deque_base<long,_std::allocator<long>_>::~_Deque_base
            (&que.super__Deque_base<long,_std::allocator<long>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&rbSamples.super__Vector_base<double,_std::allocator<double>_>);
  return true;
}

Assistant:

bool findKeyPresses(
        const TWaveformViewT<TSampleMI16> & waveform,
        TKeyPressCollectionT<TSampleMI16> & res,
        TWaveformT<TSampleMI16> & waveformThreshold,
        TWaveformT<TSampleMI16> & waveformMax,
        double thresholdBackground,
        int historySize,
        int historySizeReset,
        bool removeLowPower) {
    res.clear();
    waveformThreshold.resize(waveform.n);
    waveformMax.resize(waveform.n);

    int rbBegin = 0;
    double rbAverage = 0.0;
    std::vector<double> rbSamples(8*historySize, 0.0);

    int k = historySize;
    std::deque<int64_t> que(k);

    auto samples = waveform.samples;
    auto n       = waveform.n;

    TWaveformT<TSampleMI16> waveformAbs(n);
    for (int64_t i = 0; i < n; ++i) {
        waveformAbs[i][0] = std::abs(samples[i][0]);
    }

    for (int64_t i = 0; i < n; ++i) {
        {
            int64_t ii = i - k/2;
            if (ii >= 0) {
                rbAverage *= rbSamples.size();
                rbAverage -= rbSamples[rbBegin];
                double acur = waveformAbs[i][0];
                rbSamples[rbBegin] = acur;
                rbAverage += acur;
                rbAverage /= rbSamples.size();
                if (++rbBegin >= (int) rbSamples.size()) {
                    rbBegin = 0;
                }
            }
        }

        if (i < k) {
            while((!que.empty()) && waveformAbs[i] >= waveformAbs[que.back()]) {
                que.pop_back();
            }
            que.push_back(i);
        } else {
            while((!que.empty()) && que.front() <= i - k) {
                que.pop_front();
            }

            while((!que.empty()) && waveformAbs[i] >= waveformAbs[que.back()]) {
                que.pop_back();
            }

            que.push_back(i);

            int64_t itest = i - k/2;
            if (itest >= 2*k && itest < n - 2*k && que.front() == itest) {
                double acur = waveformAbs[itest][0];
                if (acur > thresholdBackground*rbAverage) {
                    res.emplace_back(TKeyPressDataT<TSampleMI16> { std::move(waveform), itest, 0.0, -1, -1, '?' });
                }
            }
            waveformThreshold[itest][0] = thresholdBackground*rbAverage;
            waveformMax[itest] = waveformAbs[que.front()];
        }
    }

    if (removeLowPower) {
        while (true) {
            auto oldn = res.size();

            double avgPower = 0.0;
            for (const auto & kp : res) {
                avgPower += waveformAbs[kp.pos][0];
            }
            avgPower /= res.size();

            auto tmp = std::move(res);
            for (const auto & kp : tmp) {
                if (waveformAbs[kp.pos][0] > 0.3*avgPower) {
                    res.push_back(kp);
                }
            }

            if (res.size() == oldn) break;
        }
    }

    if (res.size() > 1) {
        TKeyPressCollectionT<TSampleMI16> res2;
        res2.push_back(res.front());

        for (int i = 1; i < (int) res.size(); ++i) {
            if (res[i].pos - res2.back().pos > historySizeReset || waveformMax[res[i].pos] > waveformMax[res2.back().pos]) {
                res2.push_back(res[i]);
            }
        }

        std::swap(res, res2);
    }

    return true;
}